

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *path)

{
  bool bVar1;
  WorkingMode WVar2;
  ulong uVar3;
  pointer this_00;
  string *psVar4;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool collapse_02;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  undefined1 local_988 [8];
  string file;
  cmMakefile mf;
  cmStateDirectory local_160;
  string local_138;
  cmStateDirectory local_118;
  undefined1 local_f0 [8];
  cmStateSnapshot snapshot;
  string local_b8;
  undefined1 local_98 [8];
  string homeOutputDir;
  string homeDir;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_50;
  PositionType local_48;
  cmGlobalGenerator *pcStack_28;
  bool created;
  cmGlobalGenerator *gg;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  pcStack_28 = GetGlobalGenerator(this);
  bVar5 = pcStack_28 == (cmGlobalGenerator *)0x0;
  if (bVar5) {
    pcStack_28 = (cmGlobalGenerator *)operator_new(0x608);
    cmGlobalGenerator::cmGlobalGenerator(pcStack_28,this);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    cmState::Reset((cmStateSnapshot *)((long)&homeDir.field_2 + 8),this_00);
    (this->CurrentSnapshot).Position.Position = local_48;
    (this->CurrentSnapshot).State = (cmState *)homeDir.field_2._8_8_;
    (this->CurrentSnapshot).Position.Tree = pcStack_50;
    psVar4 = GetHomeDirectory_abi_cxx11_(this);
    std::__cxx11::string::string
              ((string *)(homeOutputDir.field_2._M_local_buf + 8),(string *)psVar4);
    psVar4 = GetHomeOutputDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_98,(string *)psVar4);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_b8,(SystemTools *)0x1,collapse)
    ;
    SetHomeDirectory(this,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&snapshot.Position.Position,(SystemTools *)0x1,collapse_00);
    SetHomeOutputDirectory(this,(string *)&snapshot.Position.Position);
    std::__cxx11::string::~string((string *)&snapshot.Position.Position);
    GetCurrentSnapshot((cmStateSnapshot *)local_f0,this);
    cmStateSnapshot::GetDirectory(&local_118,(cmStateSnapshot *)local_f0);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_138,(SystemTools *)0x1,collapse_01);
    cmStateDirectory::SetCurrentBinary(&local_118,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmStateSnapshot::GetDirectory(&local_160,(cmStateSnapshot *)local_f0);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&mf.IsSourceFileTryCompile,(SystemTools *)0x1,collapse_02);
    cmStateDirectory::SetCurrentSource(&local_160,(string *)&mf.IsSourceFileTryCompile);
    std::__cxx11::string::~string((string *)&mf.IsSourceFileTryCompile);
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_f0);
    cmMakefile::cmMakefile
              ((cmMakefile *)((long)&file.field_2 + 8),pcStack_28,(cmStateSnapshot *)local_f0);
    WVar2 = GetWorkingMode(this);
    if (WVar2 != NORMAL_MODE) {
      cmsys::SystemTools::CollapseFullPath((string *)local_988,path);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_988);
      cmMakefile::SetScriptModeFile((cmMakefile *)((long)&file.field_2 + 8),(string *)local_988);
      cmMakefile::SetArgcArgv((cmMakefile *)((long)&file.field_2 + 8),args);
      std::__cxx11::string::~string((string *)local_988);
    }
    bVar1 = cmMakefile::ReadListFile((cmMakefile *)((long)&file.field_2 + 8),path);
    if (!bVar1) {
      std::operator+(&local_9a8,"Error processing file: ",path);
      cmSystemTools::Error(&local_9a8);
      std::__cxx11::string::~string((string *)&local_9a8);
    }
    SetHomeDirectory(this,(string *)((long)&homeOutputDir.field_2 + 8));
    SetHomeOutputDirectory(this,(string *)local_98);
    cmMakefile::~cmMakefile((cmMakefile *)((long)&file.field_2 + 8));
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)(homeOutputDir.field_2._M_local_buf + 8));
  }
  if ((bVar5) && (pcStack_28 != (cmGlobalGenerator *)0x0)) {
    (*pcStack_28->_vptr_cmGlobalGenerator[1])();
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const std::string& path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg) {
    gg = new cmGlobalGenerator(this);
    created = true;
  }

  // read in the list file to fill the cache
  if (!path.empty()) {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.GetDirectory().SetCurrentSource(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.SetDefaultDefinitions();
    cmMakefile mf(gg, snapshot);
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf.SetScriptModeFile(file);

      mf.SetArgcArgv(args);
    }
    if (!mf.ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: " + path);
    }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
  }

  // free generic one if generated
  if (created) {
    delete gg;
  }
}